

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

bool AreSiblings(S2CellId a,S2CellId b,S2CellId c,S2CellId d)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((b.id_ ^ a.id_ ^ c.id_) == d.id_) {
    uVar2 = ~((-d.id_ & d.id_) * 6);
    uVar3 = uVar2 & d.id_;
    bVar1 = false;
    if ((((c.id_ & uVar2) == uVar3) && (bVar1 = false, (a.id_ & uVar2) == uVar3)) &&
       ((uVar2 & b.id_) == uVar3)) {
      bVar1 = (d.id_ & 0xfffffffffffffff) != 0;
    }
    return bVar1;
  }
  return false;
}

Assistant:

inline static bool AreSiblings(S2CellId a, S2CellId b, S2CellId c, S2CellId d) {
  // A necessary (but not sufficient) condition is that the XOR of the
  // four cells must be zero.  This is also very fast to test.
  if ((a.id() ^ b.id() ^ c.id()) != d.id()) return false;

  // Now we do a slightly more expensive but exact test.  First, compute a
  // mask that blocks out the two bits that encode the child position of
  // "id" with respect to its parent, then check that the other three
  // children all agree with "mask".
  uint64 mask = d.lsb() << 1;
  mask = ~(mask + (mask << 1));
  uint64 id_masked = (d.id() & mask);
  return ((a.id() & mask) == id_masked &&
          (b.id() & mask) == id_masked &&
          (c.id() & mask) == id_masked &&
          !d.is_face());
}